

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::exception::exception(exception *this,exception *param_2)

{
  exception *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__exception_003de480;
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  std::__cxx11::string::string((string *)(in_RDI + 0x10),(string *)(in_RSI + 0x10));
  std::__cxx11::string::string((string *)(in_RDI + 0x30),(string *)(in_RSI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 0x50),(string *)(in_RSI + 0x50));
  std::__cxx11::string::string((string *)(in_RDI + 0x70),(string *)(in_RSI + 0x70));
  return;
}

Assistant:

exception(const exception &) = default;